

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::checked::timed_mutex::
do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  cv_status cVar1;
  id tid;
  system_error *this_00;
  error_category *peVar2;
  native_handle_type nVar3;
  bool bVar4;
  error_code __ec;
  unique_lock<std::mutex> lk;
  
  tid._M_thread = pthread_self();
  std::unique_lock<std::mutex>::unique_lock(&lk,(mutex_type *)(this + 0x38));
  nVar3 = *(native_handle_type *)this;
  if (nVar3 == tid._M_thread) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    peVar2 = (error_category *)std::_V2::generic_category();
    __ec._M_cat = peVar2;
    __ec._0_8_ = 0x23;
    std::system_error::system_error(this_00,__ec,emsg);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  do {
    if (nVar3 == 0) goto LAB_00182258;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),&lk,tp);
    nVar3 = *(native_handle_type *)this;
  } while (cVar1 != timeout);
  if (nVar3 == 0) {
LAB_00182258:
    *(native_handle_type *)this = tid._M_thread;
    bVar4 = true;
    validator::deadlock::locked((uintptr_t)this,tid,false);
  }
  else {
    bVar4 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&lk);
  return bVar4;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (owner_ == tid) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg;  // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    while (owner_ != std::thread::id()) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (owner_ == std::thread::id())  // re-check predicate
          break;
        return false;
      }
    }
    owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }